

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPrimal.cpp
# Opt level: O1

void __thiscall HPrimal::primalChooseColumn(HPrimal *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  HModel *pHVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  
  this->columnIn = -1;
  if (0 < (long)this->numTot) {
    pHVar4 = this->model;
    piVar5 = (pHVar4->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (pHVar4->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (pHVar4->workDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (pHVar4->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (pHVar4->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar1 = pHVar4->dblOption[2];
    dVar11 = 0.0;
    lVar10 = 0;
    do {
      if (piVar5[lVar10] != 0) {
        dVar2 = pdVar7[lVar10];
        dVar12 = ABS(dVar2);
        if (dVar1 < dVar12) {
          dVar3 = pdVar8[lVar10];
          if ((((dVar3 == -1e+200) && (!NAN(dVar3))) && (dVar3 = pdVar9[lVar10], dVar3 == 1e+200))
             && (!NAN(dVar3))) {
            this->columnIn = (int)lVar10;
            return;
          }
          if ((dVar2 * (double)piVar6[lVar10] < -dVar1) && (dVar11 < dVar12)) {
            this->columnIn = (int)lVar10;
            dVar11 = dVar12;
          }
        }
      }
      lVar10 = lVar10 + 1;
    } while (this->numTot != lVar10);
  }
  return;
}

Assistant:

void HPrimal::primalChooseColumn() {
    columnIn = -1;
    double bestInfeas = 0;
    const int *jFlag = model->getNonbasicFlag();
    const int *jMove = model->getNonbasicMove();
    double *workDual = model->getWorkDual();
    const double *workLower = model->getWorkLower();
    const double *workUpper = model->getWorkUpper();
    const double dualTolerance = model->dblOption[DBLOPT_DUAL_TOL];

    for (int iCol = 0; iCol < numTot; iCol++) {
        if (jFlag[iCol] && fabs(workDual[iCol]) > dualTolerance) {
            // Always take free
            // TODO: if we found free,
            // Then deal with it in dual phase 1
            if (workLower[iCol] == -HSOL_CONST_INF
                    && workUpper[iCol] == HSOL_CONST_INF) {
                columnIn = iCol;
                break;
            }
            // Then look at dual infeasible
            if (jMove[iCol] * workDual[iCol] < -dualTolerance) {
                if (bestInfeas < fabs(workDual[iCol])) {
                    bestInfeas = fabs(workDual[iCol]);
                    columnIn = iCol;
                }
            }
        }
    }
}